

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_boolean_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  JSValue obj;
  JSValue val;
  
  iVar1 = JS_ToBool(ctx,*argv);
  JVar2._1_7_ = 0;
  JVar2.int32._0_1_ = iVar1 != 0;
  if ((int)new_target.tag == 3) {
    obj.tag = 1;
    obj.u.ptr = JVar2.ptr;
  }
  else {
    obj = js_create_from_ctor(ctx,new_target,6);
    if ((int)obj.tag != 6) {
      val.tag = 1;
      val.u.ptr = JVar2.ptr;
      JS_SetObjectData(ctx,obj,val);
    }
  }
  return obj;
}

Assistant:

static JSValue js_boolean_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue val, obj;
    val = JS_NewBool(ctx, JS_ToBool(ctx, argv[0]));
    if (!JS_IsUndefined(new_target)) {
        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_BOOLEAN);
        if (!JS_IsException(obj))
            JS_SetObjectData(ctx, obj, val);
        return obj;
    } else {
        return val;
    }
}